

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_factory.h
# Opt level: O1

bool __thiscall ClassFactory::Register<A>(ClassFactory *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>,_std::function<void_*(std::any)>_>,_false,_false>,_bool>
  pVar3;
  anon_class_1_0_00000001 local_41;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::type_index>
  local_40;
  
  paVar1 = &local_40.first.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + name->_M_string_length);
  local_40.second._M_target = (type_info *)&std::tuple<>::typeinfo;
  pVar3 = std::__detail::
          _Insert_base<std::pair<std::__cxx11::string,std::type_index>,std::pair<std::pair<std::__cxx11::string,std::type_index>const,std::function<void*(std::any)>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::type_index>const,std::function<void*(std::any)>>>,std::__detail::_Select1st,std::equal_to<std::pair<std::__cxx11::string,std::type_index>>,std::hash<std::pair<std::__cxx11::string,std::type_index>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          try_emplace<std::pair<std::__cxx11::string,std::type_index>,ClassFactory::Register<A>(std::__cxx11::string_const&)::_lambda(std::any)_1_>
                    ((_Insert_base<std::pair<std::__cxx11::string,std::type_index>,std::pair<std::pair<std::__cxx11::string,std::type_index>const,std::function<void*(std::any)>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::type_index>const,std::function<void*(std::any)>>>,std::__detail::_Select1st,std::equal_to<std::pair<std::__cxx11::string,std::type_index>>,std::hash<std::pair<std::__cxx11::string,std::type_index>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)this,(const_iterator)0x0,&local_40,&local_41);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

bool Register(const std::string& name) {
        return creators_.try_emplace(
            { name, typeid(std::tuple<Args...>) },
            [](std::any arg) {
                return reinterpret_cast<void *>(
                    std::apply(ClassFactory::ApplyObject<T, Args...>,
                        std::any_cast<std::tuple<Args...>>(arg)));
            }
        ).second;
    }